

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  byte bVar1;
  lu_byte lVar2;
  byte bVar3;
  Node *pNVar4;
  uint uVar5;
  ulong uVar6;
  Value *pVVar7;
  byte bVar8;
  Node *value;
  uint uVar9;
  ulong uVar10;
  TValue key;
  Value local_88;
  lu_byte local_80;
  Node *local_78;
  Table local_70;
  Value local_40;
  byte local_38;
  
  if (newasize < 0x80000001) {
    uVar9 = t->asize;
    uVar10 = (ulong)uVar9;
    local_70.flags = 0;
    setnodevector(L,&local_70,nhsize);
    if (newasize < uVar9) {
      bVar1 = t->flags;
      lVar2 = t->lsizenode;
      local_78 = t->node;
      t->lsizenode = local_70.lsizenode;
      t->node = local_70.node;
      t->flags = local_70.flags & 0x40 | bVar1 & 0xbf;
      bVar8 = local_70.flags & 0xbf;
      uVar6 = (ulong)newasize;
      do {
        bVar3 = *(byte *)((long)t->array + uVar6 + 4);
        if ((bVar3 & 0xf) != 0) {
          local_88.gc = (GCObject *)(uVar6 + 1);
          local_80 = '\x03';
          local_40 = t->array[-1 - uVar6];
          local_38 = bVar3;
          insertkey(t,(TValue *)&local_88,(TValue *)&local_40);
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != (uint)uVar6);
      local_70.lsizenode = t->lsizenode;
      local_70.node = t->node;
      local_70.flags = t->flags & 0x40 | bVar8;
      t->lsizenode = lVar2;
      t->node = local_78;
      t->flags = t->flags & 0xbf | bVar1 & 0x40;
    }
    pVVar7 = resizearray(L,t,uVar9,newasize);
    if ((newasize == 0) || (pVVar7 != (Value *)0x0)) {
      bVar1 = t->lsizenode;
      pNVar4 = t->node;
      bVar8 = t->flags;
      t->lsizenode = local_70.lsizenode;
      t->node = local_70.node;
      t->flags = local_70.flags & 0x40 | bVar8 & 0xbf;
      t->array = pVVar7;
      t->asize = newasize;
      if (pVVar7 != (Value *)0x0) {
        *(uint *)pVVar7 = newasize >> 1;
      }
      if (uVar9 < newasize) {
        do {
          *(undefined1 *)((long)t->array + uVar10 + 4) = 0x10;
          uVar10 = uVar10 + 1;
        } while (newasize != uVar10);
      }
      uVar9 = 1;
      do {
        if ((*(byte *)((long)pNVar4 + (ulong)(uVar9 - 1) * 0x18 + 8) & 0xf) != 0) {
          value = pNVar4 + (uVar9 - 1);
          local_88 = (value->u).key_val;
          local_80 = (value->u).key_tt;
          newcheckedkey(t,(TValue *)&local_88,&value->i_val);
        }
        uVar5 = uVar9 >> (bVar1 & 0x1f);
        uVar9 = uVar9 + 1;
      } while (uVar5 == 0);
      if ((bVar8 & 0x40) != 0) {
        return;
      }
      luaM_free_(L,(void *)((ulong)(bVar1 < 3) * 8 + -8 + (long)pNVar4),
                 (0x18L << (bVar1 & 0x3f)) + (ulong)(bVar1 >= 3) * 8);
      return;
    }
    luaH_resize_cold_1();
  }
  luaG_runerror(L,"table overflow");
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned newasize,
                                          unsigned nhsize) {
  Table newt;  /* to keep the new hash part */
  unsigned oldasize = t->asize;
  Value *newarray;
  if (newasize > MAXASIZE)
    luaG_runerror(L, "table overflow");
  /* create new hash part with appropriate size into 'newt' */
  newt.flags = 0;
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    /* re-insert into the new hash the elements from vanishing slice */
    exchangehashpart(t, &newt);  /* pretend table has new hash */
    reinsertOldSlice(t, oldasize, newasize);
    exchangehashpart(t, &newt);  /* restore old hash (in case of errors) */
  }
  /* allocate new array */
  newarray = resizearray(L, t, oldasize, newasize);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->asize = newasize;
  if (newarray != NULL)
    *lenhint(t) = newasize / 2u;  /* set an initial hint */
  clearNewSlice(t, oldasize, newasize);
  /* re-insert elements from old hash part into new parts */
  reinserthash(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}